

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

bool __thiscall Clasp::ClaspBerkmin::hasTopUnsat(ClaspBerkmin *this,Solver *s)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  Constraint *pCVar4;
  undefined8 in_RSI;
  Solver *in_RDI;
  uint32 x;
  uint32 stopAt;
  TypeSet ts;
  undefined4 in_stack_ffffffffffffffc8;
  uint32 in_stack_ffffffffffffffcc;
  uint32 idx;
  uint32 uVar5;
  Set local_1c;
  uint32 local_18;
  uint32 local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_14 = Solver::numLearntConstraints((Solver *)0x2347d2);
  puVar3 = std::min<unsigned_int>(&local_14,(uint *)&(in_RDI->stats).super_CoreStats.blRestarts);
  *(uint *)&(in_RDI->stats).super_CoreStats.blRestarts = *puVar3;
  local_18 = Solver::numLearntConstraints((Solver *)0x234800);
  puVar3 = std::min<unsigned_int>
                     (&local_18,(uint *)((long)&(in_RDI->stats).super_CoreStats.blRestarts + 4));
  *(uint *)((long)&(in_RDI->stats).super_CoreStats.blRestarts + 4) = *puVar3;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
             &(in_RDI->stats).super_CoreStats.restarts);
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
            ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
             &(in_RDI->stats).super_CoreStats.conflicts);
  local_1c.m = *(uint32 *)&(in_RDI->strategy_).field_0x4;
  if (1 < local_1c.m) {
    while ((uint)(in_RDI->stats).super_CoreStats.blRestarts <
           *(uint *)((long)&(in_RDI->stats).super_CoreStats.blRestarts + 4)) {
      pCVar4 = Solver::getLearnt(in_RDI,in_stack_ffffffffffffffcc);
      iVar2 = (*pCVar4->_vptr_Constraint[0xf])
                        (pCVar4,local_10,&local_1c,&(in_RDI->stats).super_CoreStats.conflicts);
      if (iVar2 != 0) {
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::swap
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)in_RDI,
                   (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        local_1c.m = 0;
        break;
      }
      *(int *)((long)&(in_RDI->stats).super_CoreStats.blRestarts + 4) =
           *(int *)((long)&(in_RDI->stats).super_CoreStats.blRestarts + 4) + -1;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                 &(in_RDI->stats).super_CoreStats.conflicts);
    }
  }
  Constraint_t::Set::addSet(&local_1c,Conflict);
  if ((uint)(in_RDI->stats).super_CoreStats.blRestarts < *(uint *)&in_RDI->strategy_) {
    idx = 0;
    uVar5 = idx;
  }
  else {
    idx = (int)(in_RDI->stats).super_CoreStats.blRestarts - *(int *)&in_RDI->strategy_;
    uVar5 = idx;
  }
  while ((uint32)(in_RDI->stats).super_CoreStats.blRestarts != uVar5) {
    pCVar4 = Solver::getLearnt(in_RDI,idx);
    iVar2 = (*pCVar4->_vptr_Constraint[0xf])
                      (pCVar4,local_10,&local_1c,&(in_RDI->stats).super_CoreStats.conflicts);
    if (iVar2 != 0) {
      if (iVar2 == 1) break;
      *(int *)((long)&(in_RDI->stats).super_CoreStats.blRestarts + 4) =
           (int)(in_RDI->stats).super_CoreStats.blRestarts;
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::swap
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)in_RDI,
                 (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                 CONCAT44(idx,in_stack_ffffffffffffffc8));
      local_1c.m = 0;
      Constraint_t::Set::addSet(&local_1c,Conflict);
    }
    *(int *)&(in_RDI->stats).super_CoreStats.blRestarts =
         (int)(in_RDI->stats).super_CoreStats.blRestarts + -1;
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::clear
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               &(in_RDI->stats).super_CoreStats.conflicts);
  }
  bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                     &(in_RDI->stats).super_CoreStats.restarts);
  if (bVar1) {
    *(int *)((long)&(in_RDI->stats).super_CoreStats.blRestarts + 4) =
         (int)(in_RDI->stats).super_CoreStats.blRestarts;
  }
  bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                     &(in_RDI->stats).super_CoreStats.conflicts);
  if (bVar1) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::swap
              ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)in_RDI,
               (pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
               CONCAT44(idx,in_stack_ffffffffffffffc8));
  }
  bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                    ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                     &(in_RDI->stats).super_CoreStats.conflicts);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool ClaspBerkmin::hasTopUnsat(Solver& s) {
	topConflict_  = std::min(s.numLearntConstraints(), topConflict_);
	topOther_     = std::min(s.numLearntConstraints(), topOther_);
	assert(topConflict_ <= topOther_);
	freeOtherLits_.clear();
	freeLits_.clear();
	TypeSet ts = types_;
	if (ts.m > 1) {
		while (topOther_ > topConflict_) {
			if (s.getLearnt(topOther_-1).isOpen(s, ts, freeLits_) != 0) {
				freeLits_.swap(freeOtherLits_);
				ts.m = 0;
				break;
			}
			--topOther_;
			freeLits_.clear();
		}
	}
	ts.addSet(Constraint_t::Conflict);
	uint32 stopAt = topConflict_ < maxBerkmin_ ? 0 : topConflict_ - maxBerkmin_;
	while (topConflict_ != stopAt) {
		uint32 x = s.getLearnt(topConflict_-1).isOpen(s, ts, freeLits_);
		if (x != 0) {
			if (x == Constraint_t::Conflict) { break; }
			topOther_  = topConflict_;
			freeLits_.swap(freeOtherLits_);
			ts.m = 0;
			ts.addSet(Constraint_t::Conflict);
		}
		--topConflict_;
		freeLits_.clear();
	}
	if (freeOtherLits_.empty())  topOther_ = topConflict_;
	if (freeLits_.empty())      freeOtherLits_.swap(freeLits_);
	return !freeLits_.empty();
}